

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_BoxFanin(Bac_Ntk_t *p,int b,int i)

{
  int iVar1;
  
  iVar1 = Bac_ObjIsBox(p,b);
  if (iVar1 != 0) {
    iVar1 = Bac_ObjFanin(p,~i + b);
    return iVar1;
  }
  __assert_fail("Bac_ObjIsBox(p, b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
}

Assistant:

static inline int            Bac_BoxFanin( Bac_Ntk_t * p, int b, int i )     { return Bac_ObjFanin(p, Bac_BoxBi(p, b, i));                                                 }